

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode Curl_read(connectdata *conn,curl_socket_t sockfd,char *buf,size_t sizerequested,ssize_t *n)

{
  Curl_easy *pCVar1;
  _Bool _Var2;
  uint uVar3;
  size_t __n;
  bool bVar4;
  ssize_t *local_90;
  ssize_t *local_88;
  ssize_t *local_80;
  size_t bytestocopy;
  int num;
  _Bool pipelining;
  Curl_easy *data;
  char *buffertofill;
  size_t bytesfromsocket;
  ssize_t nread;
  size_t *psStack_38;
  CURLcode result;
  ssize_t *n_local;
  size_t sizerequested_local;
  char *buf_local;
  connectdata *pcStack_18;
  curl_socket_t sockfd_local;
  connectdata *conn_local;
  
  nread._4_4_ = CURLE_RECV_ERROR;
  pCVar1 = conn->data;
  psStack_38 = (size_t *)n;
  n_local = (ssize_t *)sizerequested;
  sizerequested_local = (size_t)buf;
  buf_local._4_4_ = sockfd;
  pcStack_18 = conn;
  _Var2 = Curl_pipeline_wanted(pCVar1->multi,1);
  bVar4 = false;
  if (_Var2) {
    bVar4 = pcStack_18->bundle->multiuse == 1;
  }
  uVar3 = (uint)(buf_local._4_4_ == pcStack_18->sock[1]);
  *psStack_38 = 0;
  if (bVar4) {
    if ((ssize_t *)(pcStack_18->buf_len - pcStack_18->read_pos) < n_local) {
      local_80 = (ssize_t *)(pcStack_18->buf_len - pcStack_18->read_pos);
    }
    else {
      local_80 = n_local;
    }
    if (local_80 != (ssize_t *)0x0) {
      memcpy((void *)sizerequested_local,pcStack_18->master_buffer + pcStack_18->read_pos,
             (size_t)local_80);
      pcStack_18->read_pos = (long)local_80 + pcStack_18->read_pos;
      (pcStack_18->bits).stream_was_rewound = false;
      *psStack_38 = (size_t)local_80;
      return CURLE_OK;
    }
    if (n_local < (ssize_t *)0x4000) {
      local_88 = n_local;
    }
    else {
      local_88 = (ssize_t *)0x4000;
    }
    buffertofill = (char *)local_88;
    data = (Curl_easy *)pcStack_18->master_buffer;
  }
  else {
    if (n_local < (ssize_t *)(pCVar1->set).buffer_size) {
      local_90 = n_local;
    }
    else {
      local_90 = (ssize_t *)(pCVar1->set).buffer_size;
    }
    buffertofill = (char *)local_90;
    data = (Curl_easy *)sizerequested_local;
  }
  __n = (*pcStack_18->recv[(int)uVar3])
                  (pcStack_18,uVar3,(char *)data,(size_t)buffertofill,(CURLcode *)((long)&nread + 4)
                  );
  if ((long)__n < 0) {
    conn_local._4_4_ = nread._4_4_;
  }
  else {
    if (bVar4) {
      memcpy((void *)sizerequested_local,pcStack_18->master_buffer,__n);
      pcStack_18->buf_len = __n;
      pcStack_18->read_pos = __n;
    }
    *psStack_38 = __n + *psStack_38;
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_read(struct connectdata *conn, /* connection data */
                   curl_socket_t sockfd,     /* read from this socket */
                   char *buf,                /* store read data here */
                   size_t sizerequested,     /* max amount to read */
                   ssize_t *n)               /* amount bytes read */
{
  CURLcode result = CURLE_RECV_ERROR;
  ssize_t nread = 0;
  size_t bytesfromsocket = 0;
  char *buffertofill = NULL;
  struct Curl_easy *data = conn->data;

  /* if HTTP/1 pipelining is both wanted and possible */
  bool pipelining = Curl_pipeline_wanted(data->multi, CURLPIPE_HTTP1) &&
    (conn->bundle->multiuse == BUNDLE_PIPELINING);

  /* Set 'num' to 0 or 1, depending on which socket that has been sent here.
     If it is the second socket, we set num to 1. Otherwise to 0. This lets
     us use the correct ssl handle. */
  int num = (sockfd == conn->sock[SECONDARYSOCKET]);

  *n=0; /* reset amount to zero */

  /* If session can pipeline, check connection buffer  */
  if(pipelining) {
    size_t bytestocopy = CURLMIN(conn->buf_len - conn->read_pos,
                                 sizerequested);

    /* Copy from our master buffer first if we have some unread data there*/
    if(bytestocopy > 0) {
      memcpy(buf, conn->master_buffer + conn->read_pos, bytestocopy);
      conn->read_pos += bytestocopy;
      conn->bits.stream_was_rewound = FALSE;

      *n = (ssize_t)bytestocopy;
      return CURLE_OK;
    }
    /* If we come here, it means that there is no data to read from the buffer,
     * so we read from the socket */
    bytesfromsocket = CURLMIN(sizerequested, MASTERBUF_SIZE);
    buffertofill = conn->master_buffer;
  }
  else {
    bytesfromsocket = CURLMIN(sizerequested, (size_t)data->set.buffer_size);
    buffertofill = buf;
  }

  nread = conn->recv[num](conn, num, buffertofill, bytesfromsocket, &result);
  if(nread < 0)
    return result;

  if(pipelining) {
    memcpy(buf, conn->master_buffer, nread);
    conn->buf_len = nread;
    conn->read_pos = nread;
  }

  *n += nread;

  return CURLE_OK;
}